

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::expect(parser *this,token_type t)

{
  invalid_argument *this_00;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  byte local_b2;
  byte local_b1;
  string_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38 [8];
  string error_msg;
  token_type t_local;
  parser *this_local;
  
  if (t == this->last_token) {
    return;
  }
  error_msg.field_2._12_4_ = t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"parse error - unexpected ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_b1 = 0;
  local_b2 = 0;
  if (this->last_token == parse_error) {
    lexer::get_token_string(&local_b0,&this->m_lexer);
    local_b1 = 1;
    std::operator+(&local_90,"\'",&local_b0);
    local_b2 = 1;
    std::operator+(&local_70,&local_90,"\'");
  }
  else {
    lexer::token_type_name(&local_70,this->last_token);
  }
  std::__cxx11::string::operator+=(local_38,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((local_b2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  lexer::token_type_name(&local_f8,error_msg.field_2._12_4_);
  std::operator+(&local_d8,"; expected ",&local_f8);
  std::__cxx11::string::operator+=(local_38,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,local_38);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void expect(typename lexer::token_type t) const
        {
            if (t != last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                error_msg += "; expected " + lexer::token_type_name(t);
                JSON_THROW(std::invalid_argument(error_msg));
            }
        }